

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

bool __thiscall
testing::internal::OnCallSpec<bool_(const_solitaire::archivers::interfaces::Snapshot_&)>::Matches
          (OnCallSpec<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  MatchResultListener local_28;
  
  local_28.stream_ = (ostream *)0x0;
  local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_003183f8;
  bVar1 = MatcherBase<const_solitaire::archivers::interfaces::Snapshot_&>::MatchAndExplain
                    ((MatcherBase<const_solitaire::archivers::interfaces::Snapshot_&> *)
                     (this + 0x10),
                     (args->
                     super__Tuple_impl<0UL,_const_solitaire::archivers::interfaces::Snapshot_&>).
                     super__Head_base<0UL,_const_solitaire::archivers::interfaces::Snapshot_&,_false>
                     ._M_head_impl,&local_28);
  if (bVar1) {
    local_28.stream_ = (ostream *)0x0;
    local_28._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_003183f8;
    bVar1 = MatcherBase<const_std::tuple<const_solitaire::archivers::interfaces::Snapshot_&>_&>::
            MatchAndExplain((MatcherBase<const_std::tuple<const_solitaire::archivers::interfaces::Snapshot_&>_&>
                             *)(this + 0x28),args,&local_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }